

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

bool __thiscall net_uv::TCPSocket::bind6(TCPSocket *this,char *ip,uint32_t port)

{
  int iVar1;
  uv_tcp_t *puVar2;
  int32_t r_1;
  int32_t r;
  sockaddr_in6 bind_addr;
  allocator<char> local_49;
  string local_48;
  uint32_t local_24;
  char *pcStack_20;
  uint32_t port_local;
  char *ip_local;
  TCPSocket *this_local;
  
  local_24 = port;
  pcStack_20 = ip;
  ip_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,ip,&local_49);
  Socket::setIp(&this->super_Socket,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  Socket::setPort(&this->super_Socket,local_24);
  iVar1 = uv_ip6_addr(pcStack_20,local_24,(sockaddr_in6 *)&r_1);
  if (iVar1 == 0) {
    if (this->m_tcp == (uv_tcp_t *)0x0) {
      puVar2 = (uv_tcp_t *)malloc(0xf8);
      this->m_tcp = puVar2;
      uv_tcp_init((this->super_Socket).m_loop,this->m_tcp);
      this->m_tcp->data = this;
    }
    iVar1 = uv_tcp_bind(this->m_tcp,(sockaddr *)&r_1,0);
    this_local._7_1_ = iVar1 == 0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TCPSocket::bind6(const char* ip, uint32_t port)
{
	this->setIp(ip);
	this->setPort(port);

	struct sockaddr_in6 bind_addr;
	int32_t r = uv_ip6_addr(ip, port, &bind_addr);
	if (r != 0)
	{
		return false;
	}

	if (m_tcp == NULL)
	{
		m_tcp = (uv_tcp_t*)fc_malloc(sizeof(uv_tcp_t));
		int32_t r = uv_tcp_init(m_loop, m_tcp);
		CHECK_UV_ASSERT(r);

		m_tcp->data = this;
	}

	r = uv_tcp_bind(m_tcp, (const struct sockaddr*) &bind_addr, 0);

	return (r == 0);
}